

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O3

void quicly_sendbuf_emit(quicly_stream_t *stream,quicly_sendbuf_t *sb,size_t off,void *dst,
                        size_t *len,int *wrote_all)

{
  quicly_sendbuf_vec_t *pqVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  
  sVar4 = *len;
  if (sVar4 == 0) {
    uVar7 = 0;
  }
  else {
    lVar10 = 0;
    uVar7 = 0;
    uVar6 = off + sb->off_in_first_vec;
    do {
      if ((sb->vecs).size <= uVar7) goto LAB_00132c38;
      pqVar1 = (sb->vecs).entries;
      uVar9 = *(ulong *)((long)&pqVar1->len + lVar10);
      uVar5 = uVar6 - uVar9;
      if (uVar6 < uVar9) {
        puVar8 = (undefined8 *)((long)&pqVar1->cb + lVar10);
        uVar9 = uVar9 - uVar6;
        uVar6 = uVar9;
        if (sVar4 < uVar9) {
          uVar6 = sVar4;
        }
        iVar2 = (**(code **)*puVar8)(puVar8,dst);
        if (iVar2 != 0) {
          convert_error(stream,iVar2);
          return;
        }
        uVar3 = sVar4 - uVar6;
        if (sVar4 < uVar9) {
          sVar4 = uVar3;
          if (uVar3 != 0) goto LAB_00132c38;
          break;
        }
        dst = (void *)((long)dst + uVar6);
        uVar5 = 0;
        sVar4 = uVar3;
      }
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + 0x18;
      uVar6 = uVar5;
    } while (sVar4 != 0);
  }
  if (uVar7 < (sb->vecs).size) {
    iVar2 = 0;
  }
  else {
    sVar4 = 0;
LAB_00132c38:
    *len = *len - sVar4;
    iVar2 = 1;
  }
  *wrote_all = iVar2;
  return;
}

Assistant:

void quicly_sendbuf_emit(quicly_stream_t *stream, quicly_sendbuf_t *sb, size_t off, void *dst, size_t *len, int *wrote_all)
{
    size_t vec_index, capacity = *len;
    int ret;

    off += sb->off_in_first_vec;
    for (vec_index = 0; capacity != 0 && vec_index < sb->vecs.size; ++vec_index) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + vec_index;
        if (off < vec->len) {
            size_t bytes_flatten = vec->len - off;
            int partial = 0;
            if (capacity < bytes_flatten) {
                bytes_flatten = capacity;
                partial = 1;
            }
            if ((ret = vec->cb->flatten_vec(vec, dst, off, bytes_flatten)) != 0) {
                convert_error(stream, ret);
                return;
            }
            dst = (uint8_t *)dst + bytes_flatten;
            capacity -= bytes_flatten;
            off = 0;
            if (partial)
                break;
        } else {
            off -= vec->len;
        }
    }

    if (capacity == 0 && vec_index < sb->vecs.size) {
        *wrote_all = 0;
    } else {
        *len = *len - capacity;
        *wrote_all = 1;
    }
}